

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
               (VectorWriter *os,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>(os,(m->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    base_blob<256U>::Serialize<VectorWriter>((base_blob<256U> *)(p_Var2 + 1),os);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::set<K, Pred, A>& m)
{
    WriteCompactSize(os, m.size());
    for (typename std::set<K, Pred, A>::const_iterator it = m.begin(); it != m.end(); ++it)
        Serialize(os, (*it));
}